

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crunch.cpp
# Opt level: O0

bool __thiscall crunch::parse_scale_params(crunch *this,crn_mipmap_params *mipmap_params)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  crn_uint32 cVar4;
  crn_uint32 cVar5;
  uint uVar6;
  uint a;
  uint b;
  uint b_00;
  uint uVar7;
  dynamic_string *other;
  char *pcVar8;
  uint32 yh;
  uint32 xh;
  uint32 yl;
  uint32 xl;
  uint32 h_3;
  uint32 w_3;
  uint32 h_2;
  uint32 w_2;
  undefined1 local_40 [8];
  dynamic_string mode_str;
  float h_1;
  float w_1;
  int h;
  int w;
  crn_mipmap_params *mipmap_params_local;
  crunch *this_local;
  
  bVar1 = crnlib::command_line_params::has_key(&this->m_params,"rescale");
  if (bVar1) {
    iVar2 = crnlib::command_line_params::get_value_as_int(&this->m_params,"rescale",0,-1,1,0x1000,0)
    ;
    iVar3 = crnlib::command_line_params::get_value_as_int(&this->m_params,"rescale",0,-1,1,0x1000,1)
    ;
    mipmap_params->m_scale_mode = cCRNSMAbsolute;
    mipmap_params->m_scale_x = (float)iVar2;
    mipmap_params->m_scale_y = (float)iVar3;
  }
  else {
    bVar1 = crnlib::command_line_params::has_key(&this->m_params,"relrescale");
    if (bVar1) {
      mode_str.m_pStr._4_4_ =
           crnlib::command_line_params::get_value_as_float
                     (&this->m_params,"relrescale",0,1.0,1.0,256.0,0);
      mode_str.m_pStr._0_4_ =
           crnlib::command_line_params::get_value_as_float
                     (&this->m_params,"relrescale",0,1.0,1.0,256.0,1);
      mipmap_params->m_scale_mode = cCRNSMRelative;
      mipmap_params->m_scale_x = mode_str.m_pStr._4_4_;
      mipmap_params->m_scale_y = mode_str.m_pStr._0_4_;
    }
    else {
      bVar1 = crnlib::command_line_params::has_key(&this->m_params,"rescalemode");
      if (bVar1) {
        other = crnlib::command_line_params::get_value_as_string_or_empty
                          (&this->m_params,"rescalemode",0,0);
        crnlib::dynamic_string::dynamic_string((dynamic_string *)local_40,other);
        bVar1 = crnlib::dynamic_string::operator==((dynamic_string *)local_40,"nearest");
        if (bVar1) {
          mipmap_params->m_scale_mode = cCRNSMNearestPow2;
LAB_00115eda:
          bVar1 = false;
        }
        else {
          bVar1 = crnlib::dynamic_string::operator==((dynamic_string *)local_40,"hi");
          if (bVar1) {
            mipmap_params->m_scale_mode = cCRNSMNextPow2;
            goto LAB_00115eda;
          }
          bVar1 = crnlib::dynamic_string::operator==((dynamic_string *)local_40,"lo");
          if (bVar1) {
            mipmap_params->m_scale_mode = cCRNSMLowerPow2;
            goto LAB_00115eda;
          }
          pcVar8 = crnlib::dynamic_string::get_ptr((dynamic_string *)local_40);
          crnlib::console::error("Invalid rescale mode: \"%s\"",pcVar8);
          this_local._7_1_ = 0;
          bVar1 = true;
        }
        crnlib::dynamic_string::~dynamic_string((dynamic_string *)local_40);
        if (bVar1) goto LAB_0011615b;
      }
    }
  }
  bVar1 = crnlib::command_line_params::has_key(&this->m_params,"clamp");
  if (bVar1) {
    cVar4 = crnlib::command_line_params::get_value_as_int(&this->m_params,"clamp",0,1,1,0x1000,0);
    cVar5 = crnlib::command_line_params::get_value_as_int(&this->m_params,"clamp",0,1,1,0x1000,1);
    mipmap_params->m_clamp_scale = 0;
    mipmap_params->m_clamp_width = cVar4;
    mipmap_params->m_clamp_height = cVar5;
  }
  else {
    bVar1 = crnlib::command_line_params::has_key(&this->m_params,"clampScale");
    if (bVar1) {
      cVar4 = crnlib::command_line_params::get_value_as_int
                        (&this->m_params,"clampscale",0,1,1,0x1000,0);
      cVar5 = crnlib::command_line_params::get_value_as_int
                        (&this->m_params,"clampscale",0,1,1,0x1000,1);
      mipmap_params->m_clamp_scale = 1;
      mipmap_params->m_clamp_width = cVar4;
      mipmap_params->m_clamp_height = cVar5;
    }
  }
  bVar1 = crnlib::command_line_params::has_key(&this->m_params,"window");
  if (bVar1) {
    uVar6 = crnlib::command_line_params::get_value_as_int(&this->m_params,"window",0,0,0,0x1000,0);
    a = crnlib::command_line_params::get_value_as_int(&this->m_params,"window",0,0,0,0x1000,1);
    b = crnlib::command_line_params::get_value_as_int(&this->m_params,"window",0,0,0,0x1000,2);
    b_00 = crnlib::command_line_params::get_value_as_int(&this->m_params,"window",0,0,0,0x1000,3);
    uVar7 = crnlib::math::minimum<unsigned_int>(uVar6,b);
    mipmap_params->m_window_left = uVar7;
    uVar7 = crnlib::math::minimum<unsigned_int>(a,b_00);
    mipmap_params->m_window_top = uVar7;
    uVar6 = crnlib::math::maximum<unsigned_int>(uVar6,b);
    mipmap_params->m_window_right = uVar6;
    uVar6 = crnlib::math::maximum<unsigned_int>(a,b_00);
    mipmap_params->m_window_bottom = uVar6;
  }
  this_local._7_1_ = 1;
LAB_0011615b:
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool parse_scale_params(crn_mipmap_params& mipmap_params)
    {
        if (m_params.has_key("rescale"))
        {
            int w = m_params.get_value_as_int("rescale", 0, -1, 1, cCRNMaxLevelResolution, 0);
            int h = m_params.get_value_as_int("rescale", 0, -1, 1, cCRNMaxLevelResolution, 1);

            mipmap_params.m_scale_mode = cCRNSMAbsolute;
            mipmap_params.m_scale_x = (float)w;
            mipmap_params.m_scale_y = (float)h;
        }
        else if (m_params.has_key("relrescale"))
        {
            float w = m_params.get_value_as_float("relrescale", 0, 1, 1, 256, 0);
            float h = m_params.get_value_as_float("relrescale", 0, 1, 1, 256, 1);

            mipmap_params.m_scale_mode = cCRNSMRelative;
            mipmap_params.m_scale_x = w;
            mipmap_params.m_scale_y = h;
        }
        else if (m_params.has_key("rescalemode"))
        {
            // nearest | hi | lo

            dynamic_string mode_str(m_params.get_value_as_string_or_empty("rescalemode"));
            if (mode_str == "nearest")
            {
                mipmap_params.m_scale_mode = cCRNSMNearestPow2;
            }
            else if (mode_str == "hi")
            {
                mipmap_params.m_scale_mode = cCRNSMNextPow2;
            }
            else if (mode_str == "lo")
            {
                mipmap_params.m_scale_mode = cCRNSMLowerPow2;
            }
            else
            {
                console::error("Invalid rescale mode: \"%s\"", mode_str.get_ptr());
                return false;
            }
        }

        if (m_params.has_key("clamp"))
        {
            uint32 w = m_params.get_value_as_int("clamp", 0, 1, 1, cCRNMaxLevelResolution, 0);
            uint32 h = m_params.get_value_as_int("clamp", 0, 1, 1, cCRNMaxLevelResolution, 1);

            mipmap_params.m_clamp_scale = false;
            mipmap_params.m_clamp_width = w;
            mipmap_params.m_clamp_height = h;
        }
        else if (m_params.has_key("clampScale"))
        {
            uint32 w = m_params.get_value_as_int("clampscale", 0, 1, 1, cCRNMaxLevelResolution, 0);
            uint32 h = m_params.get_value_as_int("clampscale", 0, 1, 1, cCRNMaxLevelResolution, 1);

            mipmap_params.m_clamp_scale = true;
            mipmap_params.m_clamp_width = w;
            mipmap_params.m_clamp_height = h;
        }

        if (m_params.has_key("window"))
        {
            uint32 xl = m_params.get_value_as_int("window", 0, 0, 0, cCRNMaxLevelResolution, 0);
            uint32 yl = m_params.get_value_as_int("window", 0, 0, 0, cCRNMaxLevelResolution, 1);
            uint32 xh = m_params.get_value_as_int("window", 0, 0, 0, cCRNMaxLevelResolution, 2);
            uint32 yh = m_params.get_value_as_int("window", 0, 0, 0, cCRNMaxLevelResolution, 3);

            mipmap_params.m_window_left = math::minimum(xl, xh);
            mipmap_params.m_window_top = math::minimum(yl, yh);
            mipmap_params.m_window_right = math::maximum(xl, xh);
            mipmap_params.m_window_bottom = math::maximum(yl, yh);
        }

        return true;
    }